

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

size_t HTS_Tree_search_node(HTS_Tree *tree,char *string)

{
  HTS_Boolean HVar1;
  HTS_Question *in_RSI;
  long in_RDI;
  HTS_Node *node;
  char *string_00;
  
  string_00 = *(char **)(in_RDI + 0x10);
  while( true ) {
    if (string_00 == (char *)0x0) {
      HTS_error(0,"HTS_Tree_search_node: Cannot find node.\n");
      return 1;
    }
    if (*(long *)(string_00 + 0x28) == 0) break;
    HVar1 = HTS_Question_match(in_RSI,string_00);
    if (HVar1 == '\0') {
      if (*(long *)(*(long *)(string_00 + 0x18) + 8) != 0) {
        return *(size_t *)(*(long *)(string_00 + 0x18) + 8);
      }
      string_00 = *(char **)(string_00 + 0x18);
    }
    else {
      if (*(long *)(*(long *)(string_00 + 0x10) + 8) != 0) {
        return *(size_t *)(*(long *)(string_00 + 0x10) + 8);
      }
      string_00 = *(char **)(string_00 + 0x10);
    }
  }
  return *(size_t *)(string_00 + 8);
}

Assistant:

static size_t HTS_Tree_search_node(HTS_Tree * tree, const char *string)
{
   HTS_Node *node = tree->root;

   while (node != NULL) {
      if (node->quest == NULL)
         return node->pdf;
      if (HTS_Question_match(node->quest, string)) {
         if (node->yes->pdf > 0)
            return node->yes->pdf;
         node = node->yes;
      } else {
         if (node->no->pdf > 0)
            return node->no->pdf;
         node = node->no;
      }
   }

   HTS_error(0, "HTS_Tree_search_node: Cannot find node.\n");
   return 1;
}